

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm.cpp
# Opt level: O3

int __thiscall ncnn::GroupNorm::forward_inplace(GroupNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  int iVar8;
  ulong uVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  void *pvVar13;
  long lVar14;
  float *ptr;
  ulong uVar15;
  int i_2;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  int i;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  
  iVar1 = bottom_top_blob->dims;
  uVar23 = this->group;
  uVar15 = (ulong)uVar23;
  uVar19 = (long)this->channels / (long)(int)uVar23;
  uVar9 = uVar19 & 0xffffffff;
  iVar8 = (int)uVar19;
  if (iVar1 == 2) {
    if ((int)uVar23 < 1) {
      return 0;
    }
    uVar3 = bottom_top_blob->w;
    uVar24 = (ulong)uVar3;
    pvVar7 = bottom_top_blob->data;
    pvVar10 = (this->gamma_data).data;
    sVar4 = (this->gamma_data).elemsize;
    pvVar13 = (this->beta_data).data;
    sVar5 = (this->beta_data).elemsize;
    iVar2 = this->affine;
    uVar19 = uVar19 & 0xffffffff;
    fVar25 = 1.0 / (float)(int)(uVar3 * iVar8);
    lVar16 = (long)(int)uVar3 * bottom_top_blob->elemsize;
    uVar20 = 0;
    do {
      if (0 < iVar8) {
        lVar14 = uVar20 * (long)iVar8;
        fVar26 = 0.0;
        uVar22 = 0;
        pvVar11 = pvVar7;
        do {
          if (0 < (int)uVar3) {
            uVar12 = 0;
            do {
              fVar26 = fVar26 + *(float *)((long)pvVar11 + uVar12 * 4);
              uVar12 = uVar12 + 1;
            } while (uVar24 != uVar12);
          }
          uVar22 = uVar22 + 1;
          pvVar11 = (void *)((long)pvVar11 + lVar16);
        } while (uVar22 != uVar19);
        if (0 < iVar8) {
          fVar26 = fVar26 * fVar25;
          fVar27 = 0.0;
          uVar22 = 0;
          pvVar11 = pvVar7;
          do {
            if (0 < (int)uVar3) {
              uVar12 = 0;
              do {
                fVar29 = *(float *)((long)pvVar11 + uVar12 * 4) - fVar26;
                fVar27 = fVar27 + fVar29 * fVar29;
                uVar12 = uVar12 + 1;
              } while (uVar24 != uVar12);
            }
            uVar22 = uVar22 + 1;
            pvVar11 = (void *)((long)pvVar11 + lVar16);
          } while (uVar22 != uVar19);
          if (0 < iVar8) {
            fVar27 = fVar27 * fVar25;
            uVar22 = 0;
            pvVar11 = pvVar7;
            do {
              if (iVar2 == 0) {
                fVar30 = this->eps + fVar27;
                auVar28 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar30));
                fVar29 = auVar28._0_4_;
                fVar29 = fVar29 * -0.5 * (fVar30 * fVar29 * fVar29 + -3.0);
                fVar30 = fVar29 * -fVar26;
              }
              else {
                fVar30 = this->eps + fVar27;
                auVar28 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar30));
                fVar29 = auVar28._0_4_;
                fVar29 = fVar29 * -0.5 * (fVar30 * fVar29 * fVar29 + -3.0) *
                         *(float *)((long)pvVar10 + uVar22 * 4 + sVar4 * lVar14);
                fVar30 = *(float *)((long)pvVar13 + uVar22 * 4 + lVar14 * sVar5) - fVar29 * fVar26;
              }
              if (0 < (int)uVar3) {
                uVar12 = 0;
                do {
                  *(float *)((long)pvVar11 + uVar12 * 4) =
                       *(float *)((long)pvVar11 + uVar12 * 4) * fVar29 + fVar30;
                  uVar12 = uVar12 + 1;
                } while (uVar24 != uVar12);
              }
              uVar22 = uVar22 + 1;
              pvVar11 = (void *)((long)pvVar11 + lVar16);
            } while (uVar22 != uVar19);
          }
        }
      }
      uVar20 = uVar20 + 1;
      pvVar7 = (void *)((long)pvVar7 + lVar16 * iVar8);
    } while (uVar20 != uVar15);
  }
  else if (iVar1 == 1) {
    if ((int)uVar23 < 1) {
      return 0;
    }
    pvVar7 = bottom_top_blob->data;
    pvVar10 = (this->gamma_data).data;
    pvVar13 = (this->beta_data).data;
    iVar2 = this->affine;
    lVar16 = (long)iVar8;
    uVar19 = uVar19 & 0xffffffff;
    sVar4 = bottom_top_blob->elemsize;
    sVar5 = (this->beta_data).elemsize;
    sVar6 = (this->gamma_data).elemsize;
    uVar24 = 0;
    do {
      if (0 < iVar8) {
        fVar25 = 0.0;
        uVar20 = 0;
        do {
          fVar25 = fVar25 + *(float *)((long)pvVar7 + uVar20 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar19 != uVar20);
        if (0 < iVar8) {
          fVar25 = fVar25 * (1.0 / (float)iVar8);
          fVar26 = 0.0;
          uVar20 = 0;
          do {
            fVar27 = *(float *)((long)pvVar7 + uVar20 * 4) - fVar25;
            fVar26 = fVar26 + fVar27 * fVar27;
            uVar20 = uVar20 + 1;
          } while (uVar19 != uVar20);
          if (0 < iVar8) {
            fVar26 = fVar26 * (1.0 / (float)iVar8);
            uVar20 = 0;
            do {
              if (iVar2 == 0) {
                fVar29 = this->eps + fVar26;
                auVar28 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar29));
                fVar27 = auVar28._0_4_;
                fVar27 = fVar27 * -0.5 * (fVar29 * fVar27 * fVar27 + -3.0);
                fVar29 = fVar27 * -fVar25;
              }
              else {
                fVar29 = this->eps + fVar26;
                auVar28 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar29));
                fVar27 = auVar28._0_4_;
                fVar27 = fVar27 * -0.5 * (fVar29 * fVar27 * fVar27 + -3.0) *
                         *(float *)((long)pvVar10 + uVar20 * 4);
                fVar29 = *(float *)((long)pvVar13 + uVar20 * 4) - fVar27 * fVar25;
              }
              *(float *)((long)pvVar7 + uVar20 * 4) =
                   fVar27 * *(float *)((long)pvVar7 + uVar20 * 4) + fVar29;
              uVar20 = uVar20 + 1;
            } while (uVar19 != uVar20);
          }
        }
      }
      uVar24 = uVar24 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar4 * lVar16);
      pvVar13 = (void *)((long)pvVar13 + sVar5 * lVar16);
      pvVar10 = (void *)((long)pvVar10 + lVar16 * sVar6);
    } while (uVar24 != uVar15);
  }
  if (0 < (int)uVar23 && iVar1 - 3U < 2) {
    uVar23 = bottom_top_blob->d * bottom_top_blob->w * bottom_top_blob->h;
    uVar22 = (ulong)uVar23;
    pvVar7 = bottom_top_blob->data;
    uVar19 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    uVar24 = (long)bottom_top_blob->d * uVar19 * (long)bottom_top_blob->h * (long)bottom_top_blob->w
             + 0xf & 0xfffffffffffffff0;
    pvVar10 = (this->gamma_data).data;
    sVar5 = (this->gamma_data).elemsize;
    pvVar13 = (this->beta_data).data;
    sVar6 = (this->beta_data).elemsize;
    uVar20 = 0;
    lVar16 = uVar24 - uVar24 % uVar19;
    iVar1 = this->affine;
    fVar25 = 1.0 / (float)(int)(uVar23 * iVar8);
    do {
      if (0 < iVar8) {
        lVar21 = uVar20 * (long)iVar8;
        lVar14 = sVar4 * uVar19 * lVar21;
        fVar26 = 0.0;
        uVar24 = 0;
        do {
          if (0 < (int)uVar23) {
            lVar17 = 0;
            uVar12 = uVar22;
            do {
              fVar26 = fVar26 + *(float *)((long)pvVar7 + lVar17 * 4 + lVar16 * uVar24 + lVar14);
              lVar17 = lVar17 + 1;
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar9);
        if (0 < iVar8) {
          fVar26 = fVar26 * fVar25;
          fVar27 = 0.0;
          uVar24 = 0;
          do {
            if (0 < (int)uVar23) {
              lVar17 = 0;
              uVar12 = uVar22;
              do {
                fVar29 = *(float *)((long)pvVar7 + lVar17 * 4 + lVar16 * uVar24 + lVar14) - fVar26;
                fVar27 = fVar27 + fVar29 * fVar29;
                lVar17 = lVar17 + 1;
                uVar12 = uVar12 - 1;
              } while (uVar12 != 0);
            }
            uVar24 = uVar24 + 1;
          } while (uVar24 != uVar9);
          if (0 < iVar8) {
            fVar27 = fVar27 * fVar25;
            uVar24 = 0;
            do {
              if (iVar1 == 0) {
                fVar30 = this->eps + fVar27;
                auVar28 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar30));
                fVar29 = auVar28._0_4_;
                fVar29 = fVar29 * -0.5 * (fVar30 * fVar29 * fVar29 + -3.0);
                fVar30 = fVar29 * -fVar26;
              }
              else {
                fVar30 = this->eps + fVar27;
                auVar28 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar30));
                fVar29 = auVar28._0_4_;
                fVar29 = fVar29 * -0.5 * (fVar30 * fVar29 * fVar29 + -3.0) *
                         *(float *)((long)pvVar10 + uVar24 * 4 + sVar5 * lVar21);
                fVar30 = *(float *)((long)pvVar13 + uVar24 * 4 + lVar21 * sVar6) - fVar29 * fVar26;
              }
              if (0 < (int)uVar23) {
                lVar17 = lVar16 * uVar24 + lVar14;
                lVar18 = 0;
                uVar12 = uVar22;
                do {
                  *(float *)((long)pvVar7 + lVar18 * 4 + lVar17) =
                       *(float *)((long)pvVar7 + lVar18 * 4 + lVar17) * fVar29 + fVar30;
                  lVar18 = lVar18 + 1;
                  uVar12 = uVar12 - 1;
                } while (uVar12 != 0);
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 != uVar9);
          }
        }
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar15);
  }
  return 0;
}

Assistant:

int GroupNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                sum += bottom_top_blob_g[q];
            }
            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                float tmp = bottom_top_blob_g[q] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / channels_per_group;

            for (int q = 0; q < channels_per_group; q++)
            {
                float a;
                float b;
                if (affine)
                {
                    float gamma = gamma_data_g[q];
                    float beta = beta_data_g[q];

                    a = gamma / sqrtf(var + eps);
                    b = -mean * a + beta;
                }
                else
                {
                    a = 1.f / (sqrtf(var + eps));
                    b = -mean * a;
                }

                bottom_top_blob_g[q] = bottom_top_blob_g[q] * a + b;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.row(q);
                for (int i = 0; i < w; i++)
                {
                    sum += ptr[i];
                }
            }
            float mean = sum / (channels_per_group * w);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.row(q);
                for (int i = 0; i < w; i++)
                {
                    float tmp = ptr[i] - mean;
                    sqsum += tmp * tmp;
                }
            }
            float var = sqsum / (channels_per_group * w);

            for (int q = 0; q < channels_per_group; q++)
            {
                float a;
                float b;
                if (affine)
                {
                    float gamma = gamma_data_g[q];
                    float beta = beta_data_g[q];

                    a = gamma / sqrtf(var + eps);
                    b = -mean * a + beta;
                }
                else
                {
                    a = 1.f / (sqrtf(var + eps));
                    b = -mean * a;
                }

                float* ptr = bottom_top_blob_g.row(q);
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = ptr[i] * a + b;
                }
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }
            }
            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                for (int i = 0; i < size; i++)
                {
                    float tmp = ptr[i] - mean;
                    sqsum += tmp * tmp;
                }
            }
            float var = sqsum / (channels_per_group * size);

            for (int q = 0; q < channels_per_group; q++)
            {
                float a;
                float b;
                if (affine)
                {
                    float gamma = gamma_data_g[q];
                    float beta = beta_data_g[q];

                    a = gamma / sqrtf(var + eps);
                    b = -mean * a + beta;
                }
                else
                {
                    a = 1.f / (sqrtf(var + eps));
                    b = -mean * a;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * a + b;
                }
            }
        }
    }

    return 0;
}